

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O2

bool __thiscall
sisl::sparse_array_n<unsigned_int,_3,_std::allocator<unsigned_int>_>::read_from_stream
          (sparse_array_n<unsigned_int,_3,_std::allocator<unsigned_int>_> *this,ifstream *stream)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  long lVar4;
  mapped_type *pmVar5;
  int i;
  uint uVar6;
  uint val;
  uint size;
  int key;
  _Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_48;
  uint sig;
  uint _in_dims [3];
  
  if (*(int *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) != 0) {
    return false;
  }
  sig = 0;
  size = 0;
  std::istream::read((char *)stream,(long)&sig);
  if (sig == 0x53534c53) {
    std::istream::read((char *)stream,(long)_in_dims);
    lVar4 = 0;
    do {
      if (lVar4 == 3) {
        std::istream::read((char *)stream,(long)&size);
        local_48 = (_Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)&this->siteMap;
        std::
        _Hashtable<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::clear((_Hashtable<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_48);
        for (uVar6 = 0; uVar6 < size; uVar6 = uVar6 + 1) {
          key = 0;
          val = this->defaultValue;
          std::istream::read((char *)stream,(long)&key);
          std::istream::read((char *)stream,(long)&val);
          uVar3 = val;
          if (val != this->defaultValue) {
            pmVar5 = std::__detail::
                     _Map_base<int,_std::pair<const_int,_unsigned_int>,_std::allocator<std::pair<const_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[](local_48,&key);
            *pmVar5 = uVar3;
          }
        }
        return true;
      }
      puVar1 = _in_dims + lVar4;
      puVar2 = this->_dims + lVar4;
      lVar4 = lVar4 + 1;
    } while (*puVar1 == *puVar2);
  }
  return false;
}

Assistant:

bool read_from_stream(std::ifstream &stream) {
            if(!stream.good()) return false;

            unsigned int sig = 0;
            unsigned int _in_dims[N];
            unsigned int size = 0;

            // Check signature
            stream.read((char *)&sig, sizeof(unsigned int));
            if(sig != 0x53534c53) return false;

            // Check input dimensions
            stream.read(( char *)&_in_dims[0], N*sizeof(unsigned int));
            for(int i = 0; i < N; i++) {
                if(_in_dims[i] != _dims[i]) return false;
            }

            // Clear out the current map, and read into map
            stream.read((char *)&size, sizeof(unsigned int));
            siteMap.clear();
            for(int i = 0; i < size; ++i) {
                int key = 0;
                T val = defaultValue;

                stream.read((char *)&key, sizeof(unsigned int));
                stream.read((char *)&val, sizeof(T));

                if(val != defaultValue) {
                    siteMap[key] = val;
                }
            }
            return true;
        }